

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::PixelBufferAccess::PixelBufferAccess
          (PixelBufferAccess *this,TextureFormat *format,int width,int height,int depth,int rowPitch
          ,int slicePitch,void *data)

{
  int iVar1;
  
  (this->super_ConstPixelBufferAccess).m_format = *format;
  (this->super_ConstPixelBufferAccess).m_size.m_data[0] = width;
  (this->super_ConstPixelBufferAccess).m_size.m_data[1] = height;
  (this->super_ConstPixelBufferAccess).m_size.m_data[2] = depth;
  iVar1 = getPixelSize(*format);
  (this->super_ConstPixelBufferAccess).m_pitch.m_data[0] = iVar1;
  (this->super_ConstPixelBufferAccess).m_pitch.m_data[1] = rowPitch;
  (this->super_ConstPixelBufferAccess).m_pitch.m_data[2] = slicePitch;
  (this->super_ConstPixelBufferAccess).m_data = data;
  return;
}

Assistant:

PixelBufferAccess::PixelBufferAccess (const TextureFormat& format, int width, int height, int depth, int rowPitch, int slicePitch, void* data)
	: ConstPixelBufferAccess(format, width, height, depth, rowPitch, slicePitch, data)
{
}